

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharTrie.cpp
# Opt level: O2

void __thiscall
UnifiedRegex::RuntimeCharTrie::FreeBody(RuntimeCharTrie *this,ArenaAllocator *allocator)

{
  int iVar1;
  int i;
  long lVar2;
  long lVar3;
  
  lVar3 = 8;
  lVar2 = 0;
  while( true ) {
    iVar1 = this->count;
    if (iVar1 <= lVar2) break;
    FreeBody((RuntimeCharTrie *)((long)&this->children->c + lVar3),allocator);
    lVar2 = lVar2 + 1;
    lVar3 = lVar3 + 0x18;
  }
  if (0 < iVar1) {
    Memory::DeleteArray<Memory::ArenaAllocator,UnifiedRegex::RuntimeCharTrieEntry>
              (allocator,(long)iVar1,this->children);
  }
  this->count = 0;
  this->children = (RuntimeCharTrieEntry *)0x0;
  return;
}

Assistant:

void RuntimeCharTrie::FreeBody(ArenaAllocator* allocator)
    {
        for (int i = 0; i < count; i++)
            children[i].node.FreeBody(allocator);
        if (count > 0)
            AdeleteArray(allocator, count, children);
#if DBG
        count = 0;
        children = 0;
#endif
    }